

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  char *saved_cursor;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar5 = (byte *)this->cursor_;
  lVar9 = 0;
  pbVar4 = pbVar5;
  do {
    uVar10 = 0xffffffff;
    pbVar6 = pbVar4;
    if (pbVar4 < pbVar1) {
      pbVar6 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar6;
      uVar10 = (uint)*pbVar4;
    }
    if (uVar10 != (int)"nan"[lVar9]) goto LAB_001579dc;
    lVar9 = lVar9 + 1;
    pbVar4 = pbVar6;
  } while (lVar9 != 3);
  if (pbVar6 < pbVar1) {
    if (*pbVar6 == 0x3a) {
      pbVar5 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar5;
      lVar9 = 0;
      pbVar4 = pbVar5;
      do {
        uVar10 = 0xffffffff;
        pbVar6 = pbVar4;
        if (pbVar4 < pbVar1) {
          pbVar6 = pbVar4 + 1;
          this->cursor_ = (char *)pbVar6;
          uVar10 = (uint)*pbVar4;
        }
        if (uVar10 != (int)":0x"[lVar9 + 1]) goto LAB_001579dc;
        lVar9 = lVar9 + 1;
        pbVar4 = pbVar6;
      } while (lVar9 != 2);
      bVar2 = ReadHexNum(this);
      if (!bVar2) goto LAB_001579e0;
      pbVar1 = (byte *)this->buffer_end_;
      pbVar5 = (byte *)this->cursor_;
      if (pbVar1 <= pbVar5) goto LAB_001579c2;
      iVar3 = (int)pbVar5;
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if ((""[(ulong)*pbVar5 + 1] & 1U) == 0) break;
        pbVar5 = pbVar5 + 1;
        this->cursor_ = (char *)pbVar5;
        iVar7 = iVar7 + 1;
        iVar8 = (int)pbVar1 - iVar3;
      } while (pbVar5 != pbVar1);
    }
    else {
      iVar3 = (int)pbVar6;
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if ((""[(ulong)*pbVar6 + 1] & 1U) == 0) break;
        pbVar6 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar6;
        iVar7 = iVar7 + 1;
        iVar8 = (int)pbVar1 - iVar3;
      } while (pbVar6 != pbVar1);
    }
    if (iVar8 != 0) goto LAB_001579e0;
  }
LAB_001579c2:
  LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
  return __return_storage_ptr__;
LAB_001579dc:
  this->cursor_ = (char *)pbVar5;
LAB_001579e0:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}